

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<double>::Put(TPZBlockDiagonal<double> *this,int64_t row,int64_t col,double *value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  
  iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if (row < CONCAT44(extraout_var,iVar1)) {
    iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    if ((-1 < (col | row)) && (col < CONCAT44(extraout_var_00,iVar1))) {
      iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x23])(this,row,col,value);
      return iVar1;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"TPZBlockDiagonal::Put: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,",");
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xc])
            (this);
  std::ostream::_M_insert<long>((long)poVar2);
  std::operator<<((ostream *)&std::cout,"\n");
  return 0;
}

Assistant:

int TPZBlockDiagonal<TVar>::Put(const int64_t row,const int64_t col,const TVar& value )
{
	//  cout << "TPZBlockDiagonal.Put should not be called\n";
	if ( (row >= Dim()) || (col >= Dim()) || row<0 || col<0)
    {
		cout << "TPZBlockDiagonal::Put: " << row << "," << col << "," << Dim();
		cout << "\n";
		return( 0 );
    }
	
	return( PutVal( row, col, value ) );
}